

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl.cpp
# Opt level: O3

void ImGui_ImplGlfwGL3_NewFrame(void)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  double dVar3;
  int iVar4;
  ImGuiMouseCursor IVar5;
  ImGuiIO *pIVar6;
  float *pfVar7;
  uchar *puVar8;
  GLFWcursor *cursorHandle;
  int i;
  long lVar9;
  bool bVar10;
  float fVar11;
  ImVec2 IVar13;
  float fVar12;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double mouse_x;
  double mouse_y;
  int display_h;
  int display_w;
  int h;
  int w;
  undefined8 local_48;
  undefined8 local_40;
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  
  if (g_FontTexture == 0) {
    ImGui_ImplGlfwGL3_CreateDeviceObjects();
  }
  pIVar6 = ImGui::GetIO();
  glfwGetWindowSize(g_Window,(int *)&local_2c,&local_30);
  glfwGetFramebufferSize(g_Window,&local_34,&local_38);
  IVar1.y = (float)local_30;
  IVar1.x = (float)(int)local_2c;
  pIVar6->DisplaySize = IVar1;
  auVar14._4_4_ = 0;
  auVar14._0_4_ = local_2c;
  auVar14._8_4_ = local_30;
  auVar14._12_4_ = 0;
  auVar15._0_4_ = (float)local_34;
  auVar15._4_4_ = (float)local_38;
  auVar15._8_8_ = 0;
  auVar16._4_4_ = (float)(SUB168(auVar14 | _DAT_001d6a60,8) - DAT_001d6a60._8_8_);
  auVar16._0_4_ = (float)(SUB168(auVar14 | _DAT_001d6a60,0) - (double)DAT_001d6a60);
  auVar16._8_8_ = 0;
  auVar16 = divps(auVar15,auVar16);
  IVar13.x = (float)(auVar16._0_4_ & -(uint)(0 < (int)local_2c));
  IVar13.y = (float)(auVar16._4_4_ & -(uint)(0 < local_30));
  pIVar6->DisplayFramebufferScale = IVar13;
  dVar3 = glfwGetTime();
  if (0.0 < g_Time) {
    fVar12 = (float)(dVar3 - g_Time);
  }
  else {
    fVar12 = 0.016666668;
  }
  pIVar6->DeltaTime = fVar12;
  g_Time = dVar3;
  iVar4 = glfwGetWindowAttrib(g_Window,0x20001);
  if (iVar4 == 0) {
    (pIVar6->MousePos).x = -3.4028235e+38;
    (pIVar6->MousePos).y = -3.4028235e+38;
  }
  else if (pIVar6->WantSetMousePos == true) {
    glfwSetCursorPos(g_Window,(double)(pIVar6->MousePos).x,(double)(pIVar6->MousePos).y);
  }
  else {
    glfwGetCursorPos(g_Window,(double *)&local_48,(double *)&local_40);
    IVar2.y = (float)(double)CONCAT44(local_40._4_4_,(uint)local_40);
    IVar2.x = (float)(double)CONCAT44(local_48._4_4_,(int)local_48);
    pIVar6->MousePos = IVar2;
  }
  lVar9 = 0;
  do {
    bVar10 = true;
    if (g_MouseJustPressed[lVar9] == false) {
      iVar4 = glfwGetMouseButton(g_Window,(int)lVar9);
      bVar10 = iVar4 != 0;
    }
    pIVar6->MouseDown[lVar9] = bVar10;
    g_MouseJustPressed[lVar9] = false;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 3);
  if (((pIVar6->ConfigFlags & 0x20) == 0) &&
     (iVar4 = glfwGetInputMode(g_Window,0x33001), iVar4 != 0x34003)) {
    IVar5 = ImGui::GetMouseCursor();
    if ((IVar5 == -1) || (pIVar6->MouseDrawCursor != false)) {
      iVar4 = 0x34002;
    }
    else {
      cursorHandle = g_MouseCursors[IVar5];
      if (g_MouseCursors[IVar5] == (GLFWcursor *)0x0) {
        cursorHandle = g_MouseCursors[0];
      }
      glfwSetCursor(g_Window,cursorHandle);
      iVar4 = 0x34001;
    }
    glfwSetInputMode(g_Window,0x33001,iVar4);
  }
  pIVar6->NavInputs[0x10] = 0.0;
  pIVar6->NavInputs[0x11] = 0.0;
  pIVar6->NavInputs[0x12] = 0.0;
  pIVar6->NavInputs[0x13] = 0.0;
  pIVar6->NavInputs[0xc] = 0.0;
  pIVar6->NavInputs[0xd] = 0.0;
  pIVar6->NavInputs[0xe] = 0.0;
  pIVar6->NavInputs[0xf] = 0.0;
  pIVar6->NavInputs[8] = 0.0;
  pIVar6->NavInputs[9] = 0.0;
  pIVar6->NavInputs[10] = 0.0;
  pIVar6->NavInputs[0xb] = 0.0;
  pIVar6->NavInputs[4] = 0.0;
  pIVar6->NavInputs[5] = 0.0;
  pIVar6->NavInputs[6] = 0.0;
  pIVar6->NavInputs[7] = 0.0;
  pIVar6->NavInputs[0] = 0.0;
  pIVar6->NavInputs[1] = 0.0;
  pIVar6->NavInputs[2] = 0.0;
  pIVar6->NavInputs[3] = 0.0;
  pIVar6->NavInputs[0x14] = 0.0;
  if ((pIVar6->ConfigFlags & 2) == 0) goto LAB_0016e43f;
  local_48._0_4_ = 0;
  local_40._0_4_ = 0;
  pfVar7 = glfwGetJoystickAxes(0,(int *)&local_48);
  puVar8 = glfwGetJoystickButtons(0,(int *)&local_40);
  if (0 < (int)(uint)local_40) {
    if (*puVar8 == '\x01') {
      pIVar6->NavInputs[0] = 1.0;
    }
    if ((uint)local_40 != 1) {
      if (puVar8[1] == '\x01') {
        pIVar6->NavInputs[1] = 1.0;
      }
      if (2 < (uint)local_40) {
        if (puVar8[2] == '\x01') {
          pIVar6->NavInputs[3] = 1.0;
        }
        if ((uint)local_40 != 3) {
          if (puVar8[3] == '\x01') {
            pIVar6->NavInputs[2] = 1.0;
          }
          if ((uint)local_40 < 0xe) {
            if (0xb < (uint)local_40) goto LAB_0016e47e;
            if ((uint)local_40 == 0xb) goto LAB_0016e495;
            if ((uint)local_40 < 5) goto LAB_0016e345;
          }
          else {
            if (puVar8[0xd] == '\x01') {
              pIVar6->NavInputs[4] = 1.0;
            }
LAB_0016e47e:
            if (puVar8[0xb] == '\x01') {
              pIVar6->NavInputs[5] = 1.0;
            }
LAB_0016e495:
            if (puVar8[10] == '\x01') {
              pIVar6->NavInputs[6] = 1.0;
            }
            if ((0xc < (uint)local_40) && (puVar8[0xc] == '\x01')) {
              pIVar6->NavInputs[7] = 1.0;
            }
          }
          if (puVar8[4] == '\x01') {
            pIVar6->NavInputs[0xc] = 1.0;
          }
          if ((uint)local_40 < 6) {
            if (puVar8[4] == '\x01') {
              pIVar6->NavInputs[0xe] = 1.0;
            }
          }
          else {
            if (puVar8[5] == '\x01') {
              pIVar6->NavInputs[0xd] = 1.0;
            }
            if (puVar8[4] == '\x01') {
              pIVar6->NavInputs[0xe] = 1.0;
            }
            if ((5 < (uint)local_40) && (puVar8[5] == '\x01')) {
              pIVar6->NavInputs[0xf] = 1.0;
            }
          }
        }
      }
    }
  }
LAB_0016e345:
  if ((int)local_48 < 1) {
    fVar12 = 0.0;
  }
  else {
    fVar12 = *pfVar7 + 0.3;
  }
  fVar11 = 1.0;
  if (fVar12 / -0.59999996 <= 1.0) {
    fVar11 = fVar12 / -0.59999996;
  }
  if (pIVar6->NavInputs[8] <= fVar11 && fVar11 != pIVar6->NavInputs[8]) {
    pIVar6->NavInputs[8] = fVar11;
  }
  if ((int)local_48 < 1) {
    fVar12 = 0.0;
  }
  else {
    fVar12 = *pfVar7 + -0.3;
  }
  fVar11 = 1.0;
  if (fVar12 / 0.59999996 <= 1.0) {
    fVar11 = fVar12 / 0.59999996;
  }
  if (pIVar6->NavInputs[9] <= fVar11 && fVar11 != pIVar6->NavInputs[9]) {
    pIVar6->NavInputs[9] = fVar11;
  }
  fVar12 = 0.0;
  if (1 < (int)local_48) {
    fVar12 = pfVar7[1] + -0.3;
  }
  fVar11 = 1.0;
  if (fVar12 / 0.59999996 <= 1.0) {
    fVar11 = fVar12 / 0.59999996;
  }
  if (pIVar6->NavInputs[10] <= fVar11 && fVar11 != pIVar6->NavInputs[10]) {
    pIVar6->NavInputs[10] = fVar11;
  }
  fVar12 = 0.0;
  if (1 < (int)local_48) {
    fVar12 = pfVar7[1] + 0.3;
  }
  fVar11 = 1.0;
  if (fVar12 / -0.59999996 <= 1.0) {
    fVar11 = fVar12 / -0.59999996;
  }
  if (pIVar6->NavInputs[0xb] <= fVar11 && fVar11 != pIVar6->NavInputs[0xb]) {
    pIVar6->NavInputs[0xb] = fVar11;
  }
  pIVar6->BackendFlags =
       (uint)(0 < (int)(uint)local_40 && 0 < (int)local_48) | pIVar6->BackendFlags & 0xfffffffeU;
LAB_0016e43f:
  ImGui::NewFrame();
  return;
}

Assistant:

void ImGui_ImplGlfwGL3_NewFrame()
{
    if (!g_FontTexture)
        ImGui_ImplGlfwGL3_CreateDeviceObjects();

    ImGuiIO& io = ImGui::GetIO();

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    glfwGetWindowSize(g_Window, &w, &h);
    glfwGetFramebufferSize(g_Window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    io.DisplayFramebufferScale = ImVec2(w > 0 ? ((float)display_w / w) : 0, h > 0 ? ((float)display_h / h) : 0);

    // Setup time step
    double current_time =  glfwGetTime();
    io.DeltaTime = g_Time > 0.0 ? (float)(current_time - g_Time) : (float)(1.0f/60.0f);
    g_Time = current_time;

    // Setup inputs
    // (we already got mouse wheel, keyboard keys & characters from glfw callbacks polled in glfwPollEvents())
    if (glfwGetWindowAttrib(g_Window, GLFW_FOCUSED))
    {
        // Set OS mouse position if requested (only used when ImGuiConfigFlags_NavEnableSetMousePos is enabled by user)
        if (io.WantSetMousePos)
        {
            glfwSetCursorPos(g_Window, (double)io.MousePos.x, (double)io.MousePos.y);
        }
        else
        {
            double mouse_x, mouse_y;
            glfwGetCursorPos(g_Window, &mouse_x, &mouse_y);
            io.MousePos = ImVec2((float)mouse_x, (float)mouse_y);
        }
    }
    else
    {
        io.MousePos = ImVec2(-FLT_MAX,-FLT_MAX);
    }

    for (int i = 0; i < 3; i++)
    {
        // If a mouse press event came, always pass it as "mouse held this frame", so we don't miss click-release events that are shorter than 1 frame.
        io.MouseDown[i] = g_MouseJustPressed[i] || glfwGetMouseButton(g_Window, i) != 0;
        g_MouseJustPressed[i] = false;
    }

    // Update OS/hardware mouse cursor if imgui isn't drawing a software cursor
    if ((io.ConfigFlags & ImGuiConfigFlags_NoMouseCursorChange) == 0 && glfwGetInputMode(g_Window, GLFW_CURSOR) != GLFW_CURSOR_DISABLED)
    {
        ImGuiMouseCursor cursor = ImGui::GetMouseCursor();
        if (io.MouseDrawCursor || cursor == ImGuiMouseCursor_None)
        {
            glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
        }
        else
        {
            glfwSetCursor(g_Window, g_MouseCursors[cursor] ? g_MouseCursors[cursor] : g_MouseCursors[ImGuiMouseCursor_Arrow]);
            glfwSetInputMode(g_Window, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
        }
    }

    // Gamepad navigation mapping [BETA]
    memset(io.NavInputs, 0, sizeof(io.NavInputs));
    if (io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad)
    {
        // Update gamepad inputs
        #define MAP_BUTTON(NAV_NO, BUTTON_NO)       { if (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS) io.NavInputs[NAV_NO] = 1.0f; }
        #define MAP_ANALOG(NAV_NO, AXIS_NO, V0, V1) { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); if (v > 1.0f) v = 1.0f; if (io.NavInputs[NAV_NO] < v) io.NavInputs[NAV_NO] = v; }
        int axes_count = 0, buttons_count = 0;
        const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
        const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
        MAP_BUTTON(ImGuiNavInput_Activate,   0);     // Cross / A
        MAP_BUTTON(ImGuiNavInput_Cancel,     1);     // Circle / B
        MAP_BUTTON(ImGuiNavInput_Menu,       2);     // Square / X
        MAP_BUTTON(ImGuiNavInput_Input,      3);     // Triangle / Y
        MAP_BUTTON(ImGuiNavInput_DpadLeft,   13);    // D-Pad Left
        MAP_BUTTON(ImGuiNavInput_DpadRight,  11);    // D-Pad Right
        MAP_BUTTON(ImGuiNavInput_DpadUp,     10);    // D-Pad Up
        MAP_BUTTON(ImGuiNavInput_DpadDown,   12);    // D-Pad Down
        MAP_BUTTON(ImGuiNavInput_FocusPrev,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_FocusNext,  5);     // R1 / RB
        MAP_BUTTON(ImGuiNavInput_TweakSlow,  4);     // L1 / LB
        MAP_BUTTON(ImGuiNavInput_TweakFast,  5);     // R1 / RB
        MAP_ANALOG(ImGuiNavInput_LStickLeft, 0,  -0.3f,  -0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickRight,0,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickUp,   1,  +0.3f,  +0.9f);
        MAP_ANALOG(ImGuiNavInput_LStickDown, 1,  -0.3f,  -0.9f);
        #undef MAP_BUTTON
        #undef MAP_ANALOG
        if (axes_count > 0 && buttons_count > 0) 
            io.BackendFlags |= ImGuiBackendFlags_HasGamepad; 
        else 
            io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
    }

    // Start the frame. This call will update the io.WantCaptureMouse, io.WantCaptureKeyboard flag that you can use to dispatch inputs (or not) to your application.
    ImGui::NewFrame();
}